

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.hpp
# Opt level: O0

void __thiscall
asio::detail::
write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>_>
::operator()(write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>_>
             *this,error_code ec,size_t bytes_transferred,int start)

{
  bool bVar1;
  cancellation_type_t cVar2;
  size_t sVar3;
  size_t in_RCX;
  consuming_single_buffer<asio::const_buffers_1> *in_RDI;
  int in_R8D;
  size_t max_size;
  int in_stack_000000d4;
  size_t in_stack_000000d8;
  io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>
  *in_stack_000000e0;
  undefined1 in_stack_000000e8 [16];
  size_t in_stack_ffffffffffffff88;
  write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>_>
  *in_stack_ffffffffffffff90;
  const_buffers_1 *buffers;
  undefined8 in_stack_ffffffffffffffa8;
  basic_errors __e;
  error_code *in_stack_ffffffffffffffb0;
  error_code local_10;
  
  __e = (basic_errors)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  *(int *)&in_RDI[1].buffer_.super_const_buffer.size_ = in_R8D;
  if (in_R8D == 1) {
    consuming_single_buffer<asio::const_buffers_1>::total_consumed
              ((consuming_single_buffer<asio::const_buffers_1> *)
               &(in_RDI->buffer_).super_const_buffer.size_);
    base_from_completion_cond<asio::detail::transfer_all_t>::check_for_completion
              ((error_code *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
LAB_0029f924:
    buffers = (const_buffers_1 *)(in_RDI->buffer_).super_const_buffer.data_;
    consuming_single_buffer<asio::const_buffers_1>::prepare(in_RDI,(size_t)buffers);
    basic_stream_socket<asio::ip::tcp,asio::any_io_executor>::
    async_write_some<asio::const_buffers_1,asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::mutable_buffer,asio::mutable_buffer_const*,asio::detail::transfer_all_t,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::handshake_op,std::_Bind<void(nuraft::rpc_session::*(nuraft::rpc_session*,std::shared_ptr<nuraft::rpc_session>,std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)>>>>
              ((basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *)in_RDI,buffers,
               in_stack_ffffffffffffff90);
  }
  else {
    consuming_single_buffer<asio::const_buffers_1>::consume
              ((consuming_single_buffer<asio::const_buffers_1> *)
               &(in_RDI->buffer_).super_const_buffer.size_,in_RCX);
    bVar1 = std::error_code::operator_cast_to_bool(&local_10);
    if (((bVar1) || (in_RCX != 0)) &&
       (bVar1 = consuming_single_buffer<asio::const_buffers_1>::empty
                          ((consuming_single_buffer<asio::const_buffers_1> *)
                           in_stack_ffffffffffffff90), !bVar1)) {
      consuming_single_buffer<asio::const_buffers_1>::total_consumed
                ((consuming_single_buffer<asio::const_buffers_1> *)
                 &(in_RDI->buffer_).super_const_buffer.size_);
      sVar3 = base_from_completion_cond<asio::detail::transfer_all_t>::check_for_completion
                        ((error_code *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      if (sVar3 != 0) {
        cVar2 = base_from_cancellation_state<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>,_void>
                ::cancelled((base_from_cancellation_state<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>,_void>
                             *)in_RDI);
        if (cVar2 == none) goto LAB_0029f924;
        std::error_code::operator=(in_stack_ffffffffffffffb0,__e);
      }
    }
    consuming_single_buffer<asio::const_buffers_1>::total_consumed
              ((consuming_single_buffer<asio::const_buffers_1> *)
               &(in_RDI->buffer_).super_const_buffer.size_);
    asio::ssl::detail::
    io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>
    ::operator()(in_stack_000000e0,(error_code)in_stack_000000e8,in_stack_000000d8,in_stack_000000d4
                );
  }
  return;
}

Assistant:

void operator()(asio::error_code ec,
        std::size_t bytes_transferred, int start = 0)
    {
      std::size_t max_size;
      switch (start_ = start)
      {
        case 1:
        max_size = this->check_for_completion(ec, buffers_.total_consumed());
        for (;;)
        {
          {
            ASIO_HANDLER_LOCATION((__FILE__, __LINE__, "async_write"));
            stream_.async_write_some(buffers_.prepare(max_size),
                ASIO_MOVE_CAST(write_op)(*this));
          }
          return; default:
          buffers_.consume(bytes_transferred);
          if ((!ec && bytes_transferred == 0) || buffers_.empty())
            break;
          max_size = this->check_for_completion(ec, buffers_.total_consumed());
          if (max_size == 0)
            break;
          if (this->cancelled() != cancellation_type::none)
          {
            ec = error::operation_aborted;
            break;
          }
        }

        ASIO_MOVE_OR_LVALUE(WriteHandler)(handler_)(
            static_cast<const asio::error_code&>(ec),
            static_cast<const std::size_t&>(buffers_.total_consumed()));
      }
    }